

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_typeinfo.h
# Opt level: O2

bool __thiscall dukglue::detail::TypeInfo::can_cast<Dog>(TypeInfo *this)

{
  bool bVar1;
  bool bVar2;
  type_index local_10;
  
  local_10._M_target = (type_info *)&Dog::typeinfo;
  bVar1 = std::type_index::operator==(&this->index_,&local_10);
  bVar2 = true;
  if (!bVar1) {
    if (this->base_ == (TypeInfo *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = can_cast<Dog>(this->base_);
    }
  }
  return bVar2;
}

Assistant:

bool can_cast() const {
				if (index_ == typeid(T))
					return true;

				if (base_)
					return base_->can_cast<T>();

				return false;
			}